

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int pager_journal_rollback(Pager *pPager,int check_hot)

{
  unqlite_file **ppOut;
  unqlite_vfs *puVar1;
  int iVar2;
  uchar page_num [8];
  int iVar3;
  sxi32 sVar4;
  sxu32 sVar5;
  uchar *zData;
  Page *pPVar6;
  long iOfft;
  sxu32 sVar7;
  bool bVar8;
  int local_64;
  sxi64 local_60;
  int exists;
  undefined4 uStack_4c;
  uchar zMagic [8];
  int locked;
  sxu32 local_38;
  sxu32 iSectorSize;
  
  if (check_hot != 0) {
    puVar1 = pPager->pVfs;
    exists = 1;
    iVar3 = (*puVar1->xAccess)(puVar1,pPager->zJournal,0,&exists);
    if (iVar3 != 0) {
      return iVar3;
    }
    if (exists == 0) {
      return 0;
    }
    locked = 0;
    iVar3 = (*pPager->pfd->pMethods->xCheckReservedLock)(pPager->pfd,&locked);
    if (locked != 0 || iVar3 != 0) {
      return iVar3;
    }
    zMagic[0] = '\0';
    zMagic[1] = '\0';
    zMagic[2] = '\0';
    zMagic[3] = '\0';
    zMagic[4] = '\0';
    zMagic[5] = '\0';
    zMagic[6] = '\0';
    zMagic[7] = '\0';
    iVar3 = (*pPager->pfd->pMethods->xFileSize)(pPager->pfd,(unqlite_int64 *)zMagic);
    if (iVar3 != 0) {
      return iVar3;
    }
    if ((long)zMagic < 1) {
      iVar3 = pager_lock_db(pPager,2);
      if (iVar3 != 0) {
        return 0;
      }
      (*puVar1->xDelete)(puVar1,pPager->zJournal,0);
      pager_unlock_db(pPager,1);
      return 0;
    }
  }
  if (pPager->is_rdonly != 0) {
    unqliteGenErrorFormat
              (pPager->pDb,"Cannot rollback journal file \'%s\' due to a read-only database handle",
               pPager->zJournal);
    return -0x4b;
  }
  ppOut = &pPager->pjfd;
  iVar3 = unqliteOsOpen(pPager->pVfs,pPager->pAllocator,pPager->zJournal,ppOut,2);
  if (iVar3 != 0) {
    unqliteGenErrorFormat
              (pPager->pDb,"IO error while opening journal file: \'%s\'",pPager->zJournal);
    goto LAB_0011591c;
  }
  iVar3 = pager_lock_db(pPager,4);
  if (iVar3 != 0) {
    unqliteGenError(pPager->pDb,
                    "Cannot acquire an exclusive lock on the database while journal rollback");
    goto LAB_0011591c;
  }
  (*pPager->pjfd->pMethods->xSync)(pPager->pjfd,2);
  iVar3 = (*pPager->pjfd->pMethods->xFileSize)(pPager->pjfd,(unqlite_int64 *)&exists);
  if ((iVar3 == 0) && (0x1f < CONCAT44(uStack_4c,exists))) {
    iVar3 = (*(*ppOut)->pMethods->xRead)(*ppOut,zMagic,8,0);
    if (iVar3 != 0) goto LAB_001158ac;
    sVar4 = SyMemcmp(zMagic,aJournalMagic,8);
    if (sVar4 != 0) goto LAB_001158e3;
    iVar3 = ReadInt32(*ppOut,&local_38,8);
    if ((iVar3 == 0) && (iVar3 = ReadInt32(pPager->pjfd,&pPager->cksumInit,0xc), iVar3 == 0)) {
      iVar3 = ReadInt64(*ppOut,&pPager->dbSize,0x10);
      if ((iVar3 != 0) ||
         ((iVar3 = ReadInt32(*ppOut,&iSectorSize,0x18), iVar3 != 0 ||
          (iVar3 = ReadInt32(*ppOut,(sxu32 *)&locked,0x1c), iVar3 != 0)))) goto LAB_001158ac;
      if ((iSectorSize - 0x10001 < 0xffff001f || locked - 0x10001U < 0xffff01ff) ||
         (((locked + 0x1ffffU & locked) != 0 || ((iSectorSize + 0x1ffff & iSectorSize) != 0))))
      goto LAB_001158e3;
      pPager->iSectorSize = iSectorSize;
      pPager->iPageSize = locked;
      pPager->iJournalOfft = (ulong)iSectorSize;
      iVar3 = (*pPager->pfd->pMethods->xTruncate)(pPager->pfd,pPager->dbSize * (ulong)(uint)locked);
      if (iVar3 != 0) {
        unqliteGenError(pPager->pDb,"IO error while truncating database file");
        goto LAB_00115911;
      }
      zData = (uchar *)SyMemBackendAlloc(pPager->pAllocator,pPager->iPageSize);
      if (zData == (uchar *)0x0) {
        unqliteGenOutofMem(pPager->pDb);
        iVar3 = -1;
        goto LAB_00115911;
      }
      SyZero(zData,pPager->iPageSize);
      local_60 = pPager->iJournalOfft;
      local_64 = 0;
      sVar7 = local_38;
      iVar3 = local_64;
LAB_00115a9b:
      do {
        local_64 = iVar3;
        bVar8 = sVar7 == 0;
        sVar7 = sVar7 - 1;
        if (bVar8) goto LAB_001158ea;
        local_64 = ReadInt64(*ppOut,(sxu64 *)zMagic,local_60);
        if (local_64 == 0) {
          local_64 = (*pPager->pjfd->pMethods->xRead)
                               (pPager->pjfd,zData,(long)pPager->iPageSize,local_60 + 8);
          if (local_64 == 0) {
            iOfft = local_60 + 8 + (long)pPager->iPageSize;
            local_64 = ReadInt32(pPager->pjfd,(sxu32 *)&exists,iOfft);
            iVar2 = exists;
            if (local_64 == 0) {
              local_60 = iOfft + 4;
              sVar5 = pager_cksum(pPager,zData);
              page_num = zMagic;
              iVar3 = -0x3f;
              if ((iVar2 != sVar5) ||
                 (local_64 = 0, iVar3 = local_64, pPager->dbSize <= (ulong)zMagic))
              goto LAB_00115a9b;
              local_64 = (*pPager->pfd->pMethods->xWrite)
                                   (pPager->pfd,zData,(long)pPager->iPageSize,
                                    (long)zMagic * (long)pPager->iPageSize);
              if (local_64 == 0) {
                pPVar6 = pager_fetch_page(pPager,(pgno)page_num);
                if (pPVar6 != (Page *)0x0) {
                  SyMemcpy(zData,pPVar6->zData,pPager->iPageSize);
                }
                goto LAB_00115a9b;
              }
            }
          }
        }
        iVar3 = -0x3f;
      } while (local_64 == -0x3f);
      unqliteGenError(pPager->pDb,"Page playback error");
      goto LAB_001158ea;
    }
LAB_001158ac:
    if (iVar3 == -0x1c) goto LAB_001158e3;
    unqliteGenErrorFormat
              (pPager->pDb,"IO error while reading journal file \'%s\' header",pPager->zJournal);
  }
  else {
LAB_001158e3:
    local_64 = -0x1c;
    zData = (uchar *)0x0;
LAB_001158ea:
    SyMemBackendFree(pPager->pAllocator,zData);
    if (local_64 == 0) {
      (*pPager->pfd->pMethods->xSync)(pPager->pfd,3);
    }
    iVar3 = 0;
    if (local_64 != -0x1c) {
      iVar3 = local_64;
    }
  }
LAB_00115911:
  pager_unlock_db(pPager,1);
LAB_0011591c:
  unqliteOsCloseFree(pPager->pAllocator,pPager->pjfd);
  pPager->pjfd = (unqlite_file *)0x0;
  if (iVar3 == 0) {
    (*pPager->pVfs->xDelete)(pPager->pVfs,pPager->zJournal,1);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int pager_journal_rollback(Pager *pPager,int check_hot)
{
	int rc;
	if( check_hot ){
		int iExists = 0; /* cc warning */
		/* Check if the journal file exists */
		rc = pager_has_hot_journal(pPager,&iExists);
		if( rc != UNQLITE_OK  ){
			/* IO error */
			return rc;
		}
		if( !iExists ){
			/* Journal file does not exists */
			return UNQLITE_OK;
		}
	}
	if( pPager->is_rdonly ){
		unqliteGenErrorFormat(pPager->pDb,
			"Cannot rollback journal file '%s' due to a read-only database handle",pPager->zJournal);
		return UNQLITE_READ_ONLY;
	}
	/* Get an EXCLUSIVE lock on the database file. At this point it is
      ** important that a RESERVED lock is not obtained on the way to the
      ** EXCLUSIVE lock. If it were, another process might open the
      ** database file, detect the RESERVED lock, and conclude that the
      ** database is safe to read while this process is still rolling the 
      ** hot-journal back.
      ** 
      ** Because the intermediate RESERVED lock is not requested, any
      ** other process attempting to access the database file will get to 
      ** this point in the code and fail to obtain its own EXCLUSIVE lock 
      ** on the database file.
      **
      ** Unless the pager is in locking_mode=exclusive mode, the lock is
      ** downgraded to SHARED_LOCK before this function returns.
      */
	/* Open the journal file */
	rc = unqliteOsOpen(pPager->pVfs,pPager->pAllocator,pPager->zJournal,&pPager->pjfd,UNQLITE_OPEN_READWRITE);
	if( rc != UNQLITE_OK ){
		unqliteGenErrorFormat(pPager->pDb,"IO error while opening journal file: '%s'",pPager->zJournal);
		goto fail;
	}
	rc = pager_lock_db(pPager,EXCLUSIVE_LOCK);
	if( rc != UNQLITE_OK ){
		unqliteGenError(pPager->pDb,"Cannot acquire an exclusive lock on the database while journal rollback");
		goto fail;
	}
	/* Sync the journal file */
	unqliteOsSync(pPager->pjfd,UNQLITE_SYNC_NORMAL);
	/* Finally rollback the database */
	rc = pager_playback(pPager);
	/* Switch back to shared lock */
	pager_unlock_db(pPager,SHARED_LOCK);
fail:
	/* Close the journal handle */
	unqliteOsCloseFree(pPager->pAllocator,pPager->pjfd);
	pPager->pjfd = 0;
	if( rc == UNQLITE_OK ){
		/* Delete the journal file */
		unqliteOsDelete(pPager->pVfs,pPager->zJournal,TRUE);
	}
	return rc;
}